

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O3

void __thiscall VehicleState::Propagator::State2OE(Propagator *this)

{
  double dVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 in_XMM9 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  undefined1 local_c8 [48];
  double local_98;
  double dStack_90;
  double local_48;
  
  dVar6 = this->mu_;
  dVar18 = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array[2];
  dVar7 = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[0];
  dVar8 = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[1];
  dVar5 = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[2];
  dVar20 = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array[0];
  dVar1 = (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[1];
  auVar23 = *(undefined1 (*) [16])
             (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array;
  auVar9._0_8_ = dVar18 * dVar18 + dVar1 * dVar1 + dVar20 * dVar20;
  auVar9._8_8_ = 0;
  auVar25 = sqrtpd(in_XMM9,auVar9);
  dVar15 = dVar18 * dVar7 - dVar5 * dVar20;
  local_c8._8_8_ = 1.0 / dVar6;
  dVar3 = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[1];
  dVar4 = (this->vel_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
          .array[2];
  dVar26 = dVar20 * dVar3 -
           (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array[1] * dVar7;
  dVar27 = dVar1 * dVar4 -
           (this->pos_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array[2] * dVar8;
  dVar24 = auVar25._0_8_;
  dVar12 = dVar6 / dVar24;
  dVar16 = ((dVar7 * dVar15 - dVar8 * dVar27) - dVar18 * dVar12) * (double)local_c8._8_8_;
  local_c8._0_8_ = ((dVar3 * dVar26 - dVar15 * dVar5) - dVar12 * dVar20) * (double)local_c8._8_8_;
  local_c8._8_8_ = ((dVar4 * dVar27 - dVar26 * dVar7) - dVar12 * dVar1) * (double)local_c8._8_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       dVar16 * dVar16 +
       (double)local_c8._8_8_ * (double)local_c8._8_8_ +
       (double)local_c8._0_8_ * (double)local_c8._0_8_;
  auVar9 = sqrtpd(auVar13,auVar13);
  dVar3 = acos(dVar26 / SQRT(dVar26 * dVar26 + dVar15 * dVar15 + dVar27 * dVar27));
  dVar17 = dVar27 - dVar26 * 0.0;
  dVar4 = dVar26 * 0.0 - dVar15;
  dVar15 = dVar15 * 0.0 + dVar27 * -0.0;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar15 * dVar15 + dVar17 * dVar17 + dVar4 * dVar4;
  auVar25 = sqrtpd(auVar14,auVar14);
  dVar26 = auVar25._0_8_;
  dVar12 = acos(dVar4 / dVar26);
  auVar21._8_8_ = dVar26;
  auVar21._0_8_ = dVar26;
  auVar25._8_8_ = dVar17;
  auVar25._0_8_ = dVar4;
  auVar21 = divpd(auVar25,auVar21);
  local_48 = auVar9._0_8_;
  auVar10._8_8_ = local_48;
  auVar10._0_8_ = local_48;
  auVar25 = divpd(local_c8._0_16_,auVar10);
  auVar19._8_8_ = dVar16;
  auVar19._0_8_ = dVar15;
  auVar22._8_8_ = local_48;
  auVar22._0_8_ = dVar26;
  auVar9 = divpd(auVar19,auVar22);
  auVar11._8_8_ = dVar24;
  auVar11._0_8_ = dVar24;
  auVar23 = divpd(auVar23,auVar11);
  dVar26 = auVar9._8_8_;
  dVar4 = acos(auVar9._0_8_ * dVar26 + auVar21._8_8_ * auVar25._8_8_ + auVar21._0_8_ * auVar25._0_8_
              );
  local_98 = auVar23._0_8_;
  dStack_90 = auVar23._8_8_;
  dVar15 = acos(dVar26 * (dVar18 / dVar24) + dStack_90 * auVar25._8_8_ + local_98 * auVar25._0_8_);
  dVar15 = (dVar15 * 180.0) / 3.141592653589793;
  uVar2 = -(ulong)(dVar18 * dVar5 + dVar1 * dVar8 + dVar20 * dVar7 < 0.0);
  dVar20 = (double)(uVar2 & (ulong)(360.0 - dVar15) | ~uVar2 & (ulong)dVar15);
  dVar18 = SQRT(dVar8 * dVar8 + dVar7 * dVar7 + dVar5 * dVar5);
  dVar18 = -dVar6 / (dVar18 * dVar18 - (dVar6 + dVar6) / dVar24);
  dVar5 = pow(dVar18,3.0);
  dVar5 = dVar5 / dVar6;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar6 = (dVar18 * dVar18 * dVar18) / dVar6;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar7 = tan(((dVar20 * 3.141592653589793) / 180.0) * 0.5);
  dVar8 = (1.0 - local_48) / (local_48 + 1.0);
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  dVar7 = atan(dVar7 * dVar8);
  dVar7 = dVar7 + dVar7;
  dVar8 = (double)(~-(ulong)(dVar7 < 0.0) & (ulong)dVar7 |
                  (ulong)(dVar7 + 6.283185307179586) & -(ulong)(dVar7 < 0.0));
  dVar7 = sin(dVar8);
  this->a_ = dVar18;
  this->e_ = local_48;
  this->i_ = (dVar3 * 180.0) / 3.141592653589793;
  auVar23._0_8_ = dVar12 * 180.0;
  auVar23._8_8_ = dVar4 * 180.0;
  auVar25 = divpd(auVar23,_DAT_00119880);
  this->ascend_ =
       (double)(~-(ulong)(dVar17 < 0.0) & (ulong)auVar25._0_8_ |
               (ulong)(360.0 - auVar25._0_8_) & -(ulong)(dVar17 < 0.0));
  this->periap_ =
       (double)(~-(ulong)(dVar26 < 0.0) & (ulong)auVar25._8_8_ |
               (ulong)(360.0 - auVar25._8_8_) & -(ulong)(dVar26 < 0.0));
  this->nu_ = dVar20;
  this->P_ = dVar5 * 6.283185307179586;
  this->T_p_ = (dVar8 - local_48 * dVar7) / (-1.0 / dVar6) + this->t_;
  return;
}

Assistant:

void Propagator::State2OE(){

		// extract locals
		double mu = this->mu_;
		Eigen::Vector3d pos = this->pos_;
		Eigen::Vector3d vel = this->vel_;

		//normalized pos and vel
		double nr = pos.norm();
		double nv = vel.norm();

		//find the angular momentum vector
		Eigen::Vector3d h = pos.cross(vel);

		//now we can calculate semi-major axis
		double a = -mu/(pow(nv,2) - 2*mu/nr);

		//ecentricity vector
		Eigen::Vector3d ecen = (1/mu)*(vel.cross(h) - (mu/nr)*pos);

		//ecentricity
		double e = ecen.norm();

		//inclination
		double inc = acos(h[2]/h.norm()) * 180.0 / M_PI;

		// now we need the line of nodes
		Eigen::Vector3d x(0.0, 0.0, 1.0);
		Eigen::Vector3d nodeline = x.cross(h);

		//calculate longitude of ascending node
		double Ohm;
		if (nodeline[1] >= 0) {
			Ohm = acos(nodeline[0]/nodeline.norm()) * 180.0 / M_PI;
		} else {
			Ohm = 360.0 - acos(nodeline[0]/nodeline.norm()) * 180.0 / M_PI;
		}

		// normalized eccentricity, line of nodes, and position
		Eigen::Vector3d nhat = nodeline/nodeline.norm();
		Eigen::Vector3d ehat = ecen/ecen.norm();
		Eigen::Vector3d rhat = pos/pos.norm();

		// calculate argument of periapsis
		double w;
		if (ehat[2] >= 0) {
			w = acos(nhat.dot(ehat)) * 180.0 / M_PI; // Q1 or Q4
		} else {
			w = 360.0 - acos(nhat.dot(ehat)) * 180.0 / M_PI; // Q2 or Q3
		}

		//calculate true anomally
		double theta;
		if (vel.dot(pos) >= 0) {
			theta = acos(ehat.dot(rhat)) * 180.0 / M_PI; // Q1 or Q4
		} else {
			theta = 360.0 - acos(ehat.dot(rhat)) * 180.0 / M_PI; // Q2 or Q3
		}

		// convert theta to radians
		double theta_rad = theta*M_PI/180.0;

		//calculate orbital period
		double P = 2*M_PI*sqrt(pow(a,3)/mu);

		// //eccentric anomaly (radians)
		// double E = acos((e + cos(theta_rad))/(1 + e*cos(theta_rad)));

		// //mean anomally (radians)
		// double M = E - e*sin(E);

		// // time of periapsis passage
		// double T_p = this->t_ - M*P/(2*M_PI);

		//find mean motion
		double meanmot = 1.0/sqrt(a*a*a/mu);

		//eccentric annomaly
		double E = 2.0*atan( tan(theta_rad/2.0) * sqrt( (1.0 - e)/(1.0 + e)));

		//guard domain
		if(E < 0.0) {
			E = E + 2.0*M_PI;
		}

		//mean anomally (radians)
		double M = E - e*sin(E);

		// time of periapsis passage
		double T_p = this->t_ - M/meanmot;

		// output our results
		// std::cout << "semi-major axis [km]: " << a << std::endl;
		// std::cout << "eccentricity: " << e << std::endl;
		// std::cout << "inclination [deg]: " << inc << std::endl;
		// std::cout << "longitude of ascending node [deg]: " << Ohm << std::endl;
		// std::cout << "argument of periapsis [deg]: " << w << std::endl;
		// std::cout << "true anomally [deg]: " << theta << std::endl;
		// std::cout << "time of periapsis passage: " T_p << std::endl;

		//assign results to class
		this->a_ = a; //semi-major axis
		this->e_ = e; //eccentricity
		this->i_ = inc; //inclination
		this->ascend_ = Ohm; //longitude of ascending node
		this->periap_ = w; //argument of periapsis
		this->nu_ = theta; //true anomaly
		this->P_ = P; //orbital period 
		this->T_p_ = T_p; //time from periapse

	}